

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint end_00;
  uint uVar14;
  long lVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  uint *puVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  uint start_00;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  byte bVar24;
  uint local_a8 [30];
  
  bVar24 = 0;
  uVar19 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar8 = end_00 - start;
    if (0x18 < (int)uVar8) {
LAB_00580065:
      local_a8[0x18] = 0;
      local_a8[0x19] = 0;
      local_a8[0x1a] = 0;
      local_a8[0x1b] = 0;
      local_a8[0x14] = 0;
      local_a8[0x15] = 0;
      local_a8[0x16] = 0;
      local_a8[0x17] = 0;
      local_a8[0x10] = 0;
      local_a8[0x11] = 0;
      local_a8[0x12] = 0;
      local_a8[0x13] = 0;
      local_a8[0xc] = 0;
      local_a8[0xd] = 0;
      local_a8[0xe] = 0;
      local_a8[0xf] = 0;
      local_a8[8] = 0;
      local_a8[9] = 0;
      local_a8[10] = 0;
      local_a8[0xb] = 0;
      local_a8[4] = 0;
      local_a8[5] = 0;
      local_a8[6] = 0;
      local_a8[7] = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      local_a8[2] = 0;
      local_a8[3] = 0;
      start_00 = (uint)uVar19;
      iVar9 = (uVar8 >> 1) + start_00;
      pNVar1 = keys + iVar9;
      iVar9 = keys[iVar9].idx;
      lVar10 = (long)(int)start_00;
      lVar11 = -(long)(int)end_00;
      uVar23 = uVar19;
      uVar8 = end_00;
      do {
        iVar21 = (int)uVar23;
        uVar13 = (ulong)uVar8;
        if ((type & 1U) == 0) {
          if (iVar21 < (int)end_00) {
            piVar20 = &keys[iVar21].idx;
            lVar15 = 0;
            do {
              bVar7 = EQ(*piVar20,iVar9);
              if ((!bVar7) && (iVar9 <= *piVar20)) {
                uVar22 = iVar21 - (int)lVar15;
                break;
              }
              lVar15 = lVar15 + -1;
              piVar20 = piVar20 + 0x21;
              uVar22 = end_00;
            } while (iVar21 + lVar11 != lVar15);
            uVar23 = (ulong)uVar22;
          }
          if ((int)start_00 < (int)uVar8) {
            uVar12 = (ulong)(int)uVar8;
            piVar20 = &keys[uVar12].idx;
            do {
              bVar7 = EQ(*piVar20,iVar9);
              uVar13 = uVar12;
              if ((bVar7) || (*piVar20 < iVar9)) break;
              uVar12 = uVar12 - 1;
              piVar20 = piVar20 + -0x21;
              uVar13 = uVar19;
            } while (lVar10 < (long)uVar12);
          }
        }
        else {
          if (iVar21 < (int)end_00) {
            piVar20 = &keys[iVar21].idx;
            lVar15 = 0;
            do {
              bVar7 = EQ(*piVar20,iVar9);
              if ((bVar7) || (iVar9 <= *piVar20)) {
                uVar22 = iVar21 - (int)lVar15;
                break;
              }
              lVar15 = lVar15 + -1;
              piVar20 = piVar20 + 0x21;
              uVar22 = end_00;
            } while (iVar21 + lVar11 != lVar15);
            uVar23 = (ulong)uVar22;
          }
          if ((int)start_00 < (int)uVar8) {
            uVar12 = (ulong)(int)uVar8;
            piVar20 = &keys[uVar12].idx;
            do {
              bVar7 = EQ(*piVar20,iVar9);
              if ((!bVar7) && (uVar13 = uVar12, *piVar20 < iVar9)) break;
              uVar12 = uVar12 - 1;
              piVar20 = piVar20 + -0x21;
              uVar13 = uVar19;
            } while (lVar10 < (long)uVar12);
          }
        }
        iVar21 = (int)uVar23;
        uVar8 = (uint)uVar13;
        if ((int)uVar8 <= iVar21) goto LAB_0058031d;
        pNVar16 = keys + iVar21;
        puVar17 = local_a8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar17 = (pNVar16->val).m_backend.data._M_elems[0];
          pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
          puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
        }
        iVar2 = keys[iVar21].val.m_backend.exp;
        bVar7 = keys[iVar21].val.m_backend.neg;
        iVar3 = keys[iVar21].idx;
        pNVar16 = keys + (int)uVar8;
        pNVar18 = keys + iVar21;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pNVar18->val).m_backend.data._M_elems[0] = (pNVar16->val).m_backend.data._M_elems[0];
          pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
          pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar18 + (ulong)bVar24 * -8 + 4);
        }
        keys[iVar21].val.m_backend.exp = keys[(int)uVar8].val.m_backend.exp;
        keys[iVar21].val.m_backend.neg = keys[(int)uVar8].val.m_backend.neg;
        keys[iVar21].idx = keys[(int)uVar8].idx;
        puVar17 = local_a8;
        pNVar16 = keys + (int)uVar8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pNVar16->val).m_backend.data._M_elems[0] = *puVar17;
          puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
          pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
        }
        keys[(int)uVar8].val.m_backend.exp = iVar2;
        keys[(int)uVar8].val.m_backend.neg = bVar7;
        fVar5 = keys[iVar21].val.m_backend.fpclass;
        iVar6 = keys[iVar21].val.m_backend.prec_elem;
        iVar4 = keys[(int)uVar8].val.m_backend.prec_elem;
        keys[iVar21].val.m_backend.fpclass = keys[(int)uVar8].val.m_backend.fpclass;
        keys[iVar21].val.m_backend.prec_elem = iVar4;
        keys[(int)uVar8].val.m_backend.fpclass = fVar5;
        keys[(int)uVar8].val.m_backend.prec_elem = iVar6;
        keys[(int)uVar8].idx = iVar3;
        uVar23 = (ulong)(iVar21 + 1);
        uVar8 = uVar8 - 1;
      } while( true );
    }
LAB_005805bb:
    if (0 < (int)uVar8) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,end_00,compare,start);
      return;
    }
  }
  return;
LAB_0058031d:
  if ((type & 1U) == 0) {
    if ((int)start_00 < (int)uVar8) {
      uVar13 = (ulong)(int)uVar8;
      piVar20 = &keys[uVar13].idx;
      do {
        bVar7 = EQ(iVar9,*piVar20);
        if ((!bVar7) && (*piVar20 <= iVar9)) goto LAB_005803c8;
        uVar13 = uVar13 - 1;
        piVar20 = piVar20 + -0x21;
        uVar8 = start_00;
      } while (lVar10 < (long)uVar13);
    }
    else {
LAB_005803c8:
      uVar8 = (uint)uVar13;
    }
    if (uVar8 == end_00) {
      pNVar16 = keys + (int)uVar8;
      puVar17 = local_a8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar17 = (pNVar16->val).m_backend.data._M_elems[0];
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
        puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
      }
      iVar9 = keys[(int)uVar8].val.m_backend.exp;
      bVar7 = keys[(int)uVar8].val.m_backend.neg;
      iVar21 = keys[(int)uVar8].idx;
      pNVar16 = pNVar1;
      pNVar18 = keys + (int)uVar8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar18->val).m_backend.data._M_elems[0] = (pNVar16->val).m_backend.data._M_elems[0];
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
        pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar18 + (ulong)bVar24 * -8 + 4);
      }
      keys[(int)uVar8].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar8].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar8].idx = pNVar1->idx;
      puVar17 = local_a8;
      pNVar16 = pNVar1;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar16->val).m_backend.data._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
      }
      (pNVar1->val).m_backend.exp = iVar9;
      (pNVar1->val).m_backend.neg = bVar7;
      fVar5 = keys[(int)uVar8].val.m_backend.fpclass;
      iVar6 = keys[(int)uVar8].val.m_backend.prec_elem;
      iVar4 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar8].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar8].val.m_backend.prec_elem = iVar4;
      (pNVar1->val).m_backend.fpclass = fVar5;
      (pNVar1->val).m_backend.prec_elem = iVar6;
      pNVar1->idx = iVar21;
      uVar8 = uVar8 - 1;
    }
  }
  else {
    if (iVar21 < (int)end_00) {
      piVar20 = &keys[iVar21].idx;
      lVar10 = 0;
      do {
        bVar7 = EQ(iVar9,*piVar20);
        if ((!bVar7) && (iVar9 < *piVar20)) {
          uVar22 = iVar21 - (int)lVar10;
          break;
        }
        lVar10 = lVar10 + -1;
        piVar20 = piVar20 + 0x21;
        uVar22 = end_00;
      } while ((long)iVar21 - (long)(int)end_00 != lVar10);
      uVar23 = (ulong)uVar22;
    }
    uVar22 = (uint)uVar23;
    if (uVar22 == start_00) {
      pNVar16 = keys + (int)uVar22;
      puVar17 = local_a8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar17 = (pNVar16->val).m_backend.data._M_elems[0];
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
        puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
      }
      iVar9 = keys[(int)uVar22].val.m_backend.exp;
      bVar7 = keys[(int)uVar22].val.m_backend.neg;
      iVar21 = keys[(int)uVar22].idx;
      pNVar16 = pNVar1;
      pNVar18 = keys + (int)uVar22;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar18->val).m_backend.data._M_elems[0] = (pNVar16->val).m_backend.data._M_elems[0];
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
        pNVar18 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar18 + (ulong)bVar24 * -8 + 4);
      }
      keys[(int)uVar22].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar22].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar22].idx = pNVar1->idx;
      puVar17 = local_a8;
      pNVar16 = pNVar1;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pNVar16->val).m_backend.data._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar24 * -8 + 4);
      }
      (pNVar1->val).m_backend.exp = iVar9;
      (pNVar1->val).m_backend.neg = bVar7;
      fVar5 = keys[(int)uVar22].val.m_backend.fpclass;
      iVar6 = keys[(int)uVar22].val.m_backend.prec_elem;
      iVar4 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar22].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar22].val.m_backend.prec_elem = iVar4;
      (pNVar1->val).m_backend.fpclass = fVar5;
      (pNVar1->val).m_backend.prec_elem = iVar6;
      pNVar1->idx = iVar21;
      uVar23 = (ulong)(uVar22 + 1);
    }
  }
  uVar22 = (uint)uVar23;
  if ((int)(end_00 - uVar22) < (int)(uVar8 - start_00)) {
    uVar23 = uVar19;
    uVar14 = uVar8;
    uVar8 = end_00;
    start_00 = uVar22;
    if ((int)end_00 <= (int)uVar22) goto LAB_00580595;
  }
  else {
    uVar19 = uVar23;
    uVar14 = end_00;
    if ((int)uVar8 <= (int)start_00) goto LAB_00580595;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar8 + 1,compare,start_00,(bool)(~type & 1));
  uVar19 = uVar23;
LAB_00580595:
  end_00 = uVar14;
  type = (bool)(type ^ 1);
  start = (int)uVar19;
  uVar8 = end_00 - start;
  if ((int)uVar8 < 0x19) goto LAB_005805bb;
  goto LAB_00580065;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}